

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Dumper.cpp
# Opt level: O3

void __thiscall arangodb::velocypack::Dumper::appendInt(Dumper *this,int64_t v)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  ulong uVar13;
  uint uVar14;
  int iVar15;
  
  if (v < 0) {
    (*this->_sink->_vptr_Sink[2])(this->_sink,0x2d);
    v = -v;
  }
  if ((ulong)v < 1000000000000000000) {
    if (99999999999999999 < (ulong)v) goto LAB_0010d9c6;
    if (9999999999999999 < (ulong)v) goto LAB_0010d9fe;
    if (999999999999999 < (ulong)v) goto LAB_0010da33;
    if (99999999999999 < (ulong)v) goto LAB_0010da6c;
    if (0x48c27394 < (ulong)v >> 0xd) goto LAB_0010daa2;
    if (0xe8d4a50 < (ulong)v >> 0xc) goto LAB_0010dad8;
    if (0x2e90edc < (ulong)v >> 0xb) goto LAB_0010db0e;
    if (0x9502f8 < (ulong)v >> 10) goto LAB_0010db44;
    if (999999999 < (ulong)v) goto LAB_0010db7a;
    if (99999999 < (ulong)v) goto LAB_0010dbb2;
    if (9999999 < (ulong)v) goto LAB_0010dbe6;
    if (999999 < (ulong)v) goto LAB_0010dc1a;
    if (99999 < (ulong)v) goto LAB_0010dc4e;
    if (9999 < (ulong)v) goto LAB_0010dc86;
    if (999 < (ulong)v) goto LAB_0010dcba;
    if (99 < (ulong)v) goto LAB_0010dcf2;
    if ((ulong)v < 10) goto LAB_0010dd54;
  }
  else {
    auVar1._8_8_ = 0;
    auVar1._0_8_ = (ulong)v >> 0x12;
    uVar13 = (ulong)SUB161(auVar1 * ZEXT816(0x49c97747490f),0xb);
    (*this->_sink->_vptr_Sink[2])(this->_sink,uVar13 | 0x30,uVar13 | 0x30);
LAB_0010d9c6:
    auVar2._8_8_ = 0;
    auVar2._0_8_ = (ulong)v >> 0x11;
    uVar14 = SUB164(auVar2 * ZEXT816(0x5c3bd5191b53),8) >> 0x16;
    uVar13 = (ulong)CONCAT31(SUB163(auVar2 * ZEXT816(0x5c3bd5191b53),9) >> 0x16,
                             (char)uVar14 + ((byte)(uVar14 / 5) & 0xfe) * -5);
    (*this->_sink->_vptr_Sink[2])(this->_sink,uVar13 & 0xff | 0x30,uVar13 | 0x30);
LAB_0010d9fe:
    uVar14 = (uint)((ulong)v / 10000000000000000);
    uVar13 = (ulong)(uVar14 + (uVar14 / 5 & 0xfffffffe) * -5);
    (*this->_sink->_vptr_Sink[2])(this->_sink,uVar13 & 0xff | 0x30,uVar13 | 0x30);
LAB_0010da33:
    uVar14 = (uint)((ulong)v / 1000000000000000);
    uVar13 = (ulong)(uVar14 + (uVar14 / 5 & 0xfffffffe) * -5);
    (*this->_sink->_vptr_Sink[2])(this->_sink,uVar13 & 0xff | 0x30,uVar13 | 0x30);
LAB_0010da6c:
    uVar13 = (ulong)(uint)((int)((ulong)v / 100000000000000) +
                          (int)(((ulong)v / 100000000000000) / 10) * -10);
    (*this->_sink->_vptr_Sink[2])(this->_sink,uVar13 & 0xff | 0x30,uVar13 | 0x30);
LAB_0010daa2:
    uVar13 = (ulong)(uint)((int)((ulong)v / 10000000000000) +
                          (int)(((ulong)v / 10000000000000) / 10) * -10);
    (*this->_sink->_vptr_Sink[2])(this->_sink,uVar13 & 0xff | 0x30,uVar13 | 0x30);
LAB_0010dad8:
    uVar13 = (ulong)(uint)((int)((ulong)v / 1000000000000) +
                          (int)(((ulong)v / 1000000000000) / 10) * -10);
    (*this->_sink->_vptr_Sink[2])(this->_sink,uVar13 & 0xff | 0x30,uVar13 | 0x30);
LAB_0010db0e:
    uVar13 = (ulong)(uint)((int)((ulong)v / 100000000000) +
                          (int)(((ulong)v / 100000000000) / 10) * -10);
    (*this->_sink->_vptr_Sink[2])(this->_sink,uVar13 & 0xff | 0x30,uVar13 | 0x30);
LAB_0010db44:
    uVar13 = (ulong)(uint)((int)((ulong)v / 10000000000) +
                          (int)(((ulong)v / 10000000000) / 10) * -10);
    (*this->_sink->_vptr_Sink[2])(this->_sink,uVar13 & 0xff | 0x30,uVar13 | 0x30);
LAB_0010db7a:
    auVar3._8_8_ = 0;
    auVar3._0_8_ = (ulong)v / 1000000000;
    iVar15 = SUB164(auVar3 * ZEXT816(0x199999999999999a),8);
    uVar13 = (ulong)(uint)((int)((ulong)v / 1000000000) + iVar15 * -10);
    (*this->_sink->_vptr_Sink[2])
              (this->_sink,uVar13 & 0xff | 0x30,(ulong)(uint)(iVar15 * 2),uVar13 | 0x30);
LAB_0010dbb2:
    auVar4._8_8_ = 0;
    auVar4._0_8_ = (ulong)v / 100000000;
    iVar15 = SUB164(auVar4 * ZEXT816(0x199999999999999a),8);
    uVar13 = (ulong)(uint)((int)((ulong)v / 100000000) + iVar15 * -10);
    (*this->_sink->_vptr_Sink[2])
              (this->_sink,uVar13 & 0xff | 0x30,(ulong)(uint)(iVar15 * 2),uVar13 | 0x30);
LAB_0010dbe6:
    auVar5._8_8_ = 0;
    auVar5._0_8_ = (ulong)v / 10000000;
    iVar15 = SUB164(auVar5 * ZEXT816(0x199999999999999a),8);
    uVar13 = (ulong)(uint)((int)((ulong)v / 10000000) + iVar15 * -10);
    (*this->_sink->_vptr_Sink[2])
              (this->_sink,uVar13 & 0xff | 0x30,(ulong)(uint)(iVar15 * 2),uVar13 | 0x30);
LAB_0010dc1a:
    auVar6._8_8_ = 0;
    auVar6._0_8_ = (ulong)v / 1000000;
    iVar15 = SUB164(auVar6 * ZEXT816(0x199999999999999a),8);
    uVar13 = (ulong)(uint)((int)((ulong)v / 1000000) + iVar15 * -10);
    (*this->_sink->_vptr_Sink[2])
              (this->_sink,uVar13 & 0xff | 0x30,(ulong)(uint)(iVar15 * 2),uVar13 | 0x30);
LAB_0010dc4e:
    auVar7._8_8_ = 0;
    auVar7._0_8_ = (ulong)v / 100000;
    iVar15 = SUB164(auVar7 * ZEXT816(0x199999999999999a),8);
    uVar13 = (ulong)(uint)((int)((ulong)v / 100000) + iVar15 * -10);
    (*this->_sink->_vptr_Sink[2])
              (this->_sink,uVar13 & 0xff | 0x30,(ulong)(uint)(iVar15 * 2),uVar13 | 0x30);
LAB_0010dc86:
    auVar8._8_8_ = 0;
    auVar8._0_8_ = (ulong)v / 10000;
    iVar15 = SUB164(auVar8 * ZEXT816(0x199999999999999a),8);
    uVar13 = (ulong)(uint)((int)((ulong)v / 10000) + iVar15 * -10);
    (*this->_sink->_vptr_Sink[2])
              (this->_sink,uVar13 & 0xff | 0x30,(ulong)(uint)(iVar15 * 2),uVar13 | 0x30);
LAB_0010dcba:
    auVar9._8_8_ = 0;
    auVar9._0_8_ = (ulong)v / 1000;
    iVar15 = SUB164(auVar9 * ZEXT816(0x199999999999999a),8);
    uVar13 = (ulong)(uint)((int)((ulong)v / 1000) + iVar15 * -10);
    (*this->_sink->_vptr_Sink[2])
              (this->_sink,uVar13 & 0xff | 0x30,(ulong)(uint)(iVar15 * 2),uVar13 | 0x30);
LAB_0010dcf2:
    auVar10._8_8_ = 0;
    auVar10._0_8_ = (ulong)v / 100;
    iVar15 = SUB164(auVar10 * ZEXT816(0x199999999999999a),8);
    uVar13 = (ulong)(uint)((int)((ulong)v / 100) + iVar15 * -10);
    (*this->_sink->_vptr_Sink[2])
              (this->_sink,uVar13 & 0xff | 0x30,(ulong)(uint)(iVar15 * 2),uVar13 | 0x30);
  }
  auVar11._8_8_ = 0;
  auVar11._0_8_ = (ulong)v / 10;
  iVar15 = SUB164(auVar11 * ZEXT816(0x199999999999999a),8);
  uVar13 = (ulong)(uint)((int)((ulong)v / 10) + iVar15 * -10);
  (*this->_sink->_vptr_Sink[2])
            (this->_sink,uVar13 & 0xff | 0x30,(ulong)(uint)(iVar15 * 2),uVar13 | 0x30);
LAB_0010dd54:
  auVar12._8_8_ = 0;
  auVar12._0_8_ = v;
  (*this->_sink->_vptr_Sink[2])
            (this->_sink,
             (ulong)(byte)((char)v + ((byte)(SUB164(auVar12 * ZEXT816(0xcccccccccccccccd),8) >> 2) &
                                     0xfe) * -5 | 0x30));
  return;
}

Assistant:

void Dumper::appendInt(int64_t v) {
  if (v == INT64_MIN) {
    _sink->append("-9223372036854775808", 20);
    return;
  }
  if (v < 0) {
    _sink->push_back('-');
    v = -v;
  }

  if (1000000000000000000LL <= v) {
    _sink->push_back('0' + (v / 1000000000000000000LL) % 10);
  }
  if (100000000000000000LL <= v) {
    _sink->push_back('0' + (v / 100000000000000000LL) % 10);
  }
  if (10000000000000000LL <= v) {
    _sink->push_back('0' + (v / 10000000000000000LL) % 10);
  }
  if (1000000000000000LL <= v) {
    _sink->push_back('0' + (v / 1000000000000000LL) % 10);
  }
  if (100000000000000LL <= v) {
    _sink->push_back('0' + (v / 100000000000000LL) % 10);
  }
  if (10000000000000LL <= v) {
    _sink->push_back('0' + (v / 10000000000000LL) % 10);
  }
  if (1000000000000LL <= v) {
    _sink->push_back('0' + (v / 1000000000000LL) % 10);
  }
  if (100000000000LL <= v) {
    _sink->push_back('0' + (v / 100000000000LL) % 10);
  }
  if (10000000000LL <= v) {
    _sink->push_back('0' + (v / 10000000000LL) % 10);
  }
  if (1000000000LL <= v) {
    _sink->push_back('0' + (v / 1000000000LL) % 10);
  }
  if (100000000LL <= v) {
    _sink->push_back('0' + (v / 100000000LL) % 10);
  }
  if (10000000LL <= v) {
    _sink->push_back('0' + (v / 10000000LL) % 10);
  }
  if (1000000LL <= v) {
    _sink->push_back('0' + (v / 1000000LL) % 10);
  }
  if (100000LL <= v) {
    _sink->push_back('0' + (v / 100000LL) % 10);
  }
  if (10000LL <= v) {
    _sink->push_back('0' + (v / 10000LL) % 10);
  }
  if (1000LL <= v) {
    _sink->push_back('0' + (v / 1000LL) % 10);
  }
  if (100LL <= v) {
    _sink->push_back('0' + (v / 100LL) % 10);
  }
  if (10LL <= v) {
    _sink->push_back('0' + (v / 10LL) % 10);
  }

  _sink->push_back('0' + (v % 10));
}